

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O0

int arg_parse_enum_helper(arg *arg,char *err_msg)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  char *endptr;
  long rawval;
  arg_enum_list *listptr;
  char *local_30;
  long local_28;
  long *local_20;
  char *local_18;
  long local_10;
  
  if (in_RSI != (char *)0x0) {
    *in_RSI = '\0';
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = strtol(*(char **)(in_RDI + 0x10),&local_30,10);
  if ((**(char **)(local_10 + 0x10) != '\0') && (*local_30 == '\0')) {
    for (local_20 = *(long **)(*(long *)(local_10 + 0x20) + 0x20); *local_20 != 0;
        local_20 = local_20 + 2) {
      if ((int)local_20[1] == local_28) {
        return (int)local_28;
      }
    }
  }
  local_20 = *(long **)(*(long *)(local_10 + 0x20) + 0x20);
  while( true ) {
    if (*local_20 == 0) {
      if (local_18 != (char *)0x0) {
        snprintf(local_18,200,"Option %s: Invalid value \'%s\'\n",*(undefined8 *)(local_10 + 8),
                 *(undefined8 *)(local_10 + 0x10));
      }
      return 0;
    }
    iVar1 = strcmp(*(char **)(local_10 + 0x10),(char *)*local_20);
    if (iVar1 == 0) break;
    local_20 = local_20 + 2;
  }
  return (int)local_20[1];
}

Assistant:

int arg_parse_enum_helper(const struct arg *arg, char *err_msg) {
  const struct arg_enum_list *listptr;
  long rawval;  // NOLINT
  char *endptr;

  if (err_msg) err_msg[0] = '\0';

  /* First see if the value can be parsed as a raw value */
  rawval = strtol(arg->val, &endptr, 10);
  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    /* Got a raw value, make sure it's valid */
    for (listptr = arg->def->enums; listptr->name; listptr++)
      if (listptr->val == rawval) return (int)rawval;
  }

  /* Next see if it can be parsed as a string */
  for (listptr = arg->def->enums; listptr->name; listptr++)
    if (!strcmp(arg->val, listptr->name)) return listptr->val;

  SET_ERR_STRING("Option %s: Invalid value '%s'\n", arg->name, arg->val);
  return 0;
}